

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O0

void __thiscall UUID_VersionNameBasedSHA1_Test::TestBody(UUID_VersionNameBasedSHA1_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_80;
  Message local_78;
  version_type local_70 [2];
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  uuid t1;
  UUID_VersionNameBasedSHA1_Test *this_local;
  
  t1.data_._M_elems._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"ffffffff-ffff-5fff-ffff-ffffffffffff",&local_41)
  ;
  pstore::uuid::uuid((uuid *)local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_70[1] = 5;
  local_70[0] = pstore::uuid::version((uuid *)local_20);
  testing::internal::EqHelper::
  Compare<pstore::uuid::version_type,_pstore::uuid::version_type,_nullptr>
            ((EqHelper *)local_68,"pstore::uuid::version_type::name_based_sha1","t1.version ()",
             local_70 + 1,local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x98,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST (UUID, VersionNameBasedSHA1) {
    pstore::uuid const t1 ("ffffffff-ffff-5fff-ffff-ffffffffffff");
    EXPECT_EQ (pstore::uuid::version_type::name_based_sha1, t1.version ());
}